

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::DefaultReadCordTest_ReadSmallCordAfterBackUp_Test::
~DefaultReadCordTest_ReadSmallCordAfterBackUp_Test
          (DefaultReadCordTest_ReadSmallCordAfterBackUp_Test *this)

{
  DefaultReadCordTest_ReadSmallCordAfterBackUp_Test *this_local;
  
  ~DefaultReadCordTest_ReadSmallCordAfterBackUp_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DefaultReadCordTest, ReadSmallCordAfterBackUp) {
  std::string source = "abcdefghijk";
  ArrayInputStream input(source.data(), source.size());

  absl::Cord dest;
  const void* buffer;
  int size;
  EXPECT_TRUE(input.Next(&buffer, &size));
  input.BackUp(size - 1);

  EXPECT_TRUE(input.ReadCord(&dest, source.size() - 2));

  EXPECT_EQ(dest, "bcdefghij");
}